

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeNVE::PositionStep(FluctuatingChargeNVE *this,RealType dt)

{
  pointer ppAVar1;
  Atom *pAVar2;
  DataStoragePointer DVar3;
  Snapshot *pSVar4;
  long lVar5;
  Molecule *pMVar6;
  pointer ppAVar7;
  long lVar8;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar6 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    if (pMVar6 != (Molecule *)0x0) {
      do {
        ppAVar7 = (pMVar6->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar1 = (pMVar6->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar7 != ppAVar1) {
          pAVar2 = *ppAVar7;
          while (pAVar2 != (Atom *)0x0) {
            ppAVar7 = ppAVar7 + 1;
            DVar3 = (pAVar2->super_StuntDouble).storage_;
            pSVar4 = ((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar8 = (long)(pAVar2->super_StuntDouble).localIndex_;
            lVar5 = *(long *)((long)&(pSVar4->atomData).flucQPos.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + DVar3);
            *(double *)(lVar5 + lVar8 * 8) =
                 *(double *)
                  (*(long *)((long)&(pSVar4->atomData).flucQVel.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + DVar3) + lVar8 * 8) * dt +
                 *(double *)(lVar5 + lVar8 * 8);
            if (ppAVar7 == ppAVar1) break;
            pAVar2 = *ppAVar7;
          }
        }
        pMVar6 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
      } while (pMVar6 != (Molecule *)0x0);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::PositionStep(RealType dt) {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel = atom->getFlucQVel();
        cpos = atom->getFlucQPos();

        cpos += dt * cvel;
        atom->setFlucQPos(cpos);
      }
    }
  }